

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

bool __thiscall Array::setData(Array *this,int v,int x,int y)

{
  bool bVar1;
  
  bVar1 = false;
  if ((((-1 < x) && (-1 < y)) && (x < this->_width)) && (y < this->_height)) {
    this->_data[(uint)y][(uint)x] = v;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Array::setData(int v, int x, int y)
{

	if (x < 0 || x >= _width
		|| y < 0 || y >= _height)
		return false;

	_data[y][x] = v;

	return true;
}